

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uchar * lodepng_chunk_next(uchar *chunk)

{
  uint uVar1;
  char *in_RDI;
  uint total_chunk_length;
  uchar *local_8;
  
  if (((((*in_RDI == -0x77) && (in_RDI[1] == 'P')) && (in_RDI[2] == 'N')) &&
      ((in_RDI[3] == 'G' && (in_RDI[4] == '\r')))) &&
     ((in_RDI[5] == '\n' && ((in_RDI[6] == '\x1a' && (in_RDI[7] == '\n')))))) {
    local_8 = (uchar *)(in_RDI + 8);
  }
  else {
    uVar1 = lodepng_chunk_length((uchar *)0x128054);
    local_8 = (uchar *)(in_RDI + (uVar1 + 0xc));
  }
  return local_8;
}

Assistant:

unsigned char* lodepng_chunk_next(unsigned char* chunk) {
  if(chunk[0] == 0x89 && chunk[1] == 0x50 && chunk[2] == 0x4e && chunk[3] == 0x47
    && chunk[4] == 0x0d && chunk[5] == 0x0a && chunk[6] == 0x1a && chunk[7] == 0x0a) {
    /* Is PNG magic header at start of PNG file. Jump to first actual chunk. */
    return chunk + 8;
  } else {
    unsigned total_chunk_length = lodepng_chunk_length(chunk) + 12;
    return chunk + total_chunk_length;
  }
}